

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  size_type sVar2;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int i_1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  float shrink_threshold;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  size_t bucket_count;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  float grow_threshold;
  size_type kSize;
  key_type *in_stack_fffffffffffffb98;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  float in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  float in_stack_fffffffffffffbb8;
  float fVar3;
  value_type in_stack_fffffffffffffbbc;
  key_type in_stack_fffffffffffffbc0;
  key_type in_stack_fffffffffffffbc4;
  char *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  float local_414;
  float local_404;
  float in_stack_fffffffffffffc18;
  float in_stack_fffffffffffffc1c;
  float in_stack_fffffffffffffc20;
  value_type in_stack_fffffffffffffc24;
  AssertionResult local_368 [2];
  size_type local_348;
  AssertionResult local_340;
  value_type *in_stack_fffffffffffffcd8;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffce0;
  AssertionResult local_2b0 [2];
  float local_28c;
  undefined8 local_288;
  AssertionResult local_280;
  float local_26c;
  size_type local_258;
  AssertionResult local_250 [2];
  size_type local_230;
  AssertionResult local_228 [6];
  value_type local_1bc;
  int local_1b8;
  key_type local_1b4;
  value_type local_154;
  size_type local_150;
  float local_134;
  undefined8 local_130;
  AssertionResult local_128 [2];
  float local_104;
  AssertionResult local_100;
  key_type local_f0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e0 [12];
  float local_14;
  undefined8 local_10;
  
  local_10 = 0x4098;
  for (local_14 = 0.2; local_14 <= 0.8; local_14 = local_14 + 0.2) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffba0,
               (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffba0,
               (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_e0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (size_type)in_stack_fffffffffffffbc8,
               (hasher *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
               (key_equal *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_e0);
    local_f0 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    google::
    HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::max_load_factor((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      in_stack_fffffffffffffbac);
    google::
    HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::min_load_factor((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      in_stack_fffffffffffffbac);
    local_104 = google::
                HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::max_load_factor((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffba0);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (float *)in_stack_fffffffffffffba0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcaee72);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0xcaeed5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaef46);
    local_130 = 0;
    local_134 = google::
                HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::min_load_factor((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffba0);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (float *)in_stack_fffffffffffffba0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcaefef);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0xcaf052);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaf0c3);
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::resize((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)in_stack_fffffffffffffba0,(size_type)in_stack_fffffffffffffb98);
    local_150 = google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcaf0e4);
    local_154 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffba0,
                               (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    local_1b4 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffba0,
                            (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    local_1b8 = 2;
    while( true ) {
      in_stack_fffffffffffffc24 =
           HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20))
      ;
      local_1bc = in_stack_fffffffffffffc24;
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcaf1d6);
      in_stack_fffffffffffffc1c = (float)(long)sVar2;
      in_stack_fffffffffffffc20 = (float)sVar2;
      in_stack_fffffffffffffc18 = (float)local_150;
      if (local_14 <= in_stack_fffffffffffffc20 / in_stack_fffffffffffffc18) break;
      local_230 = google::
                  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcaf2a3);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 (unsigned_long *)in_stack_fffffffffffffba0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
        testing::AssertionResult::failure_message((AssertionResult *)0xcaf31e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
        testing::Message::~Message((Message *)0xcaf37b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaf3e6);
      local_1b8 = local_1b8 + 1;
    }
    local_258 = google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcaf40a);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (unsigned_long *)in_stack_fffffffffffffba0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_250);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcaf473);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0xcaf4d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaf53b);
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcaf579);
    local_404 = (float)sVar2;
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xcaf5c8);
    local_414 = (float)sVar2;
    local_26c = local_404 / local_414 + -0.01;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_resizing_parameters
              ((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)in_stack_fffffffffffffba0,(float)((ulong)in_stack_fffffffffffffb98 >> 0x20),
               SUB84(in_stack_fffffffffffffb98,0));
    local_288 = 0x3ff0000000000000;
    local_28c = google::
                HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::max_load_factor((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffba0);
    testing::internal::EqHelper::Compare<double,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (double *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (float *)in_stack_fffffffffffffba0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      testing::AssertionResult::failure_message((AssertionResult *)0xcaf6da);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0xcaf737);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaf7a5);
    in_stack_fffffffffffffbd4 =
         google::
         HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         ::min_load_factor((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffffba0);
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (float *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (float *)in_stack_fffffffffffffba0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      in_stack_fffffffffffffbc8 =
           testing::AssertionResult::failure_message((AssertionResult *)0xcaf83c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0xcaf899);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcaf90a);
    local_150 = google::
                BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)0xcaf917);
    while( true ) {
      in_stack_fffffffffffffbc4 =
           HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      in_stack_fffffffffffffbc0 =
           HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::erase((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      in_stack_fffffffffffffbbc =
           HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffba0,(int)((ulong)in_stack_fffffffffffffb98 >> 0x20))
      ;
      google::
      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      sVar2 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xcaf9f7);
      in_stack_fffffffffffffbb4 = (float)(long)sVar2;
      in_stack_fffffffffffffba8 = (float)sVar2;
      in_stack_fffffffffffffbac = (float)(long)local_150;
      in_stack_fffffffffffffbb0 = (float)local_150;
      if (in_stack_fffffffffffffba8 / in_stack_fffffffffffffbb0 <= local_26c) break;
      fVar3 = in_stack_fffffffffffffba8;
      local_348 = google::
                  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)0xcafaa8);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffbbc,fVar3),
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 (unsigned_long *)in_stack_fffffffffffffba0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
        in_stack_fffffffffffffba0 =
             (HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)testing::AssertionResult::failure_message((AssertionResult *)0xcafb23);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                   in_stack_fffffffffffffbbc,
                   (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
        testing::Message::~Message((Message *)0xcafb80);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcafbeb);
    }
    in_stack_fffffffffffffbb8 = in_stack_fffffffffffffba8;
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)0xcafc0f);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               (unsigned_long *)in_stack_fffffffffffffba0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      in_stack_fffffffffffffb98 =
           (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xcafc78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (Type)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                 in_stack_fffffffffffffbbc,
                 (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (Message *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffba0);
      testing::Message::~Message((Message *)0xcafcd3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xcafd3e);
    google::
    HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashtable
              ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xcafd74);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}